

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O1

bool duckdb::ParseBoolean(Value *value,string *loption)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  vector<duckdb::Value,_true> *this;
  const_reference value_00;
  BinderException *pBVar7;
  Value local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  LogicalType local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (value->is_null == true) {
    pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
    local_e0.type_._0_8_ = (long)&local_e0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"\"%s\" expects a non-null boolean value (e.g. TRUE or 1)","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pcVar3 = (loption->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar3,pcVar3 + loption->_M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar7,(string *)&local_e0,&local_48);
    __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((value->type_).id_ == LIST) {
    this = ListValue::GetChildren(value);
    pVVar1 = (this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar2 = (this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pVVar1 == pVVar2) {
      bVar4 = true;
    }
    else {
      if (0x40 < (ulong)((long)pVVar2 - (long)pVVar1)) {
        pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
        local_e0.type_._0_8_ = (long)&local_e0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,
                   "\"%s\" expects a single argument as a boolean value (e.g. TRUE or 1)","");
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        pcVar3 = (loption->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar3,pcVar3 + loption->_M_string_length);
        BinderException::BinderException<std::__cxx11::string>(pBVar7,(string *)&local_e0,&local_a0)
        ;
        __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      value_00 = vector<duckdb::Value,_true>::operator[](this,0);
      bVar4 = ParseBoolean(value_00,loption);
    }
  }
  else {
    LogicalType::LogicalType(&local_e0.type_,FLOAT);
    bVar5 = LogicalType::operator==(&value->type_,&local_e0.type_);
    bVar4 = true;
    if (!bVar5) {
      LogicalType::LogicalType((LogicalType *)&local_a0,DOUBLE);
      bVar6 = LogicalType::operator==(&value->type_,(LogicalType *)&local_a0);
      if (!bVar6) {
        bVar4 = (value->type_).id_ == DECIMAL;
      }
    }
    if (!bVar5) {
      LogicalType::~LogicalType((LogicalType *)&local_a0);
    }
    LogicalType::~LogicalType(&local_e0.type_);
    if (bVar4) {
      pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
      local_e0.type_._0_8_ = (long)&local_e0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"\"%s\" expects a boolean value (e.g. TRUE or 1)","");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      pcVar3 = (loption->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar3,pcVar3 + loption->_M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar7,(string *)&local_e0,&local_68);
      __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType(&local_80,BOOLEAN);
    Value::DefaultCastAs(&local_e0,value,&local_80,false);
    bVar4 = BooleanValue::Get(&local_e0);
    Value::~Value(&local_e0);
    LogicalType::~LogicalType(&local_80);
  }
  return bVar4;
}

Assistant:

static bool ParseBoolean(const Value &value, const string &loption) {
	if (value.IsNull()) {
		throw BinderException("\"%s\" expects a non-null boolean value (e.g. TRUE or 1)", loption);
	}
	if (value.type().id() == LogicalTypeId::LIST) {
		auto &children = ListValue::GetChildren(value);
		return ParseBoolean(children, loption);
	}
	if (value.type() == LogicalType::FLOAT || value.type() == LogicalType::DOUBLE ||
	    value.type().id() == LogicalTypeId::DECIMAL) {
		throw BinderException("\"%s\" expects a boolean value (e.g. TRUE or 1)", loption);
	}
	return BooleanValue::Get(value.DefaultCastAs(LogicalType::BOOLEAN));
}